

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O1

void borg_load_read_message(char *message,borg_read_message *read_message)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  
  read_message->message_p1 = (char *)0x0;
  read_message->message_p2 = (char *)0x0;
  read_message->message_p3 = (char *)0x0;
  pcVar2 = strchr(message,0x7d);
  if (pcVar2 == (char *)0x0) {
    if (message != (char *)0x0) {
      message = message + (*message == ' ');
    }
LAB_002397b1:
    pcVar2 = string_make(message);
    read_message->message_p1 = pcVar2;
    return;
  }
  pcVar2 = pcVar2 + 1;
  if (*message != '{') {
    pcVar2 = message;
  }
  pcVar3 = strchr(pcVar2,0x7b);
  if (pcVar3 == (char *)0x0) {
    message = pcVar2 + (*pcVar2 == ' ');
    goto LAB_002397b1;
  }
  pcVar2 = pcVar2 + -1;
  do {
    pcVar6 = pcVar2 + 1;
    pcVar2 = pcVar2 + 1;
  } while (*pcVar6 == ' ');
  sVar4 = strlen(pcVar2);
  sVar5 = strlen(pcVar3);
  pcVar2 = format("%.*s",(ulong)(uint)((int)sVar4 - (int)sVar5),pcVar2);
  pcVar2 = string_make(pcVar2);
  read_message->message_p1 = pcVar2;
  pcVar2 = strchr(pcVar3,0x7d);
  if (pcVar2 == (char *)0x0) {
    return;
  }
  pcVar3 = pcVar2 + 1;
  pcVar6 = strchr(pcVar3,0x7b);
  if (pcVar6 == (char *)0x0) {
    for (; *pcVar3 == ' '; pcVar3 = pcVar3 + 1) {
    }
    if (*pcVar3 == '\0') {
      return;
    }
    iVar1 = strcmp(pcVar3,".");
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    do {
      pcVar3 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar3 == ' ');
    sVar4 = strlen(pcVar2);
    sVar5 = strlen(pcVar6);
    uVar7 = (int)sVar4 - (int)sVar5;
    if (uVar7 != 0) {
      pcVar2 = format("%.*s",(ulong)uVar7,pcVar2);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = pcVar2 + (*pcVar2 == ' ');
      }
      pcVar2 = string_make(pcVar2);
      read_message->message_p2 = pcVar2;
    }
    pcVar2 = strchr(pcVar6,0x7d);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    pcVar3 = pcVar2 + 1;
    pcVar6 = strchr(pcVar3,0x7b);
    if (pcVar6 == (char *)0x0) {
      for (; *pcVar3 == ' '; pcVar3 = pcVar3 + 1) {
      }
      if (*pcVar3 == '\0') {
        return;
      }
      iVar1 = strcmp(pcVar3,".");
      if (iVar1 == 0) {
        return;
      }
      pcVar6 = read_message->message_p2;
      pcVar2 = string_make(pcVar3);
      if (pcVar6 != (char *)0x0) {
LAB_00239723:
        read_message->message_p3 = pcVar2;
        return;
      }
      goto LAB_002397dd;
    }
    do {
      pcVar3 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar3 == ' ');
    sVar4 = strlen(pcVar2);
    sVar5 = strlen(pcVar6);
    pcVar6 = read_message->message_p2;
    pcVar3 = format("%.*s",(ulong)(uint)((int)sVar4 - (int)sVar5),pcVar2);
    if (pcVar6 != (char *)0x0) {
      if (pcVar3 != (char *)0x0) {
        pcVar3 = pcVar3 + (*pcVar3 == ' ');
      }
      pcVar2 = string_make(pcVar3);
      goto LAB_00239723;
    }
    if (pcVar3 != (char *)0x0) {
      pcVar3 = pcVar3 + (*pcVar3 == ' ');
    }
  }
  pcVar2 = string_make(pcVar3);
LAB_002397dd:
  read_message->message_p2 = pcVar2;
  return;
}

Assistant:

static void borg_load_read_message(
    char *message, struct borg_read_message *read_message)
{
    read_message->message_p1 = NULL;
    read_message->message_p2 = NULL;
    read_message->message_p3 = NULL;

    char *suffix             = strchr(message, '}');
    if (!suffix) {
        /* no variables, use message as is */
        read_message->message_p1 = string_make(borg_trim_lead_space(message));
        return;
    }
    /* skip leading variable, if there is one */
    if (message[0] == '{')
        suffix++;
    else
        suffix = message;
    char *var = strchr(suffix, '{');
    if (!var) {
        /* one variable, use message post variable */
        read_message->message_p1 = string_make(borg_trim_lead_space(suffix));
        return;
    }
    while (suffix[0] == ' ')
        suffix++;
    int part_len             = strlen(suffix) - strlen(var);
    read_message->message_p1 = string_make(format("%.*s", part_len, suffix));
    suffix += part_len;
    suffix = strchr(var, '}');
    if (!suffix)
        return; /* this should never happen but ... if a string is { with no }*/
    suffix++;
    var = strchr(suffix, '{');
    if (!var) {
        while (suffix[0] == ' ')
            suffix++;

        /* two variables, ignore if last part is just . */
        if (strlen(suffix) && !streq(suffix, "."))
            read_message->message_p2 = string_make(suffix);
        return;
    }
    while (suffix[0] == ' ')
        suffix++;
    part_len = strlen(suffix) - strlen(var);
    if (part_len) {
        read_message->message_p2 = string_make(
            borg_trim_lead_space(format("%.*s", part_len, suffix)));
    }
    suffix += part_len;
    suffix = strchr(var, '}');
    if (!suffix)
        return; /* this should never happen but ... if a string is { with no }*/
    suffix++;
    var = strchr(suffix, '{');
    if (!var) {
        while (suffix[0] == ' ')
            suffix++;
        /* three variables, ignore if last part is just . */
        if (strlen(suffix) && !streq(suffix, ".")) {
            if (read_message->message_p2) {
                read_message->message_p3
                    = string_make(borg_trim_lead_space(suffix));
            } else {
                read_message->message_p2
                    = string_make(borg_trim_lead_space(suffix));
            }
        }
        return;
    }
    while (suffix[0] == ' ')
        suffix++;
    part_len = strlen(suffix) - strlen(var);
    if (read_message->message_p2)
        read_message->message_p3 = string_make(
            borg_trim_lead_space(format("%.*s", part_len, suffix)));
    else
        read_message->message_p2 = string_make(
            borg_trim_lead_space(format("%.*s", part_len, suffix)));

    return;
}